

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8.cc
# Opt level: O2

int PKCS8_marshal_encrypted_private_key
              (CBB *out,int pbe_nid,EVP_CIPHER *cipher,char *pass,size_t pass_len,uint8_t *salt,
              size_t salt_len,int iterations,EVP_PKEY *pkey)

{
  int iVar1;
  uint uVar2;
  uchar *puVar3;
  size_t sVar4;
  uint32_t iterations_00;
  uint uVar5;
  int n1;
  size_t plaintext_len;
  uint8_t *plaintext;
  int n2;
  CBB *local_178;
  uint8_t *ptr;
  char *local_168;
  size_t local_160;
  CBB plaintext_cbb;
  CBB ciphertext;
  CBB epki;
  ScopedEVP_CIPHER_CTX ctx;
  
  plaintext = (uint8_t *)0x0;
  plaintext_len = 0;
  local_178 = out;
  local_168 = pass;
  local_160 = pass_len;
  EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)&ctx);
  uVar5 = 0;
  if (salt == (uint8_t *)0x0) {
    sVar4 = 8;
    if (salt_len != 0) {
      sVar4 = salt_len;
    }
    salt = (uint8_t *)OPENSSL_malloc(sVar4);
    if (salt == (uchar *)0x0) {
      salt = (uchar *)0x0;
      goto LAB_002d2f21;
    }
    iVar1 = RAND_bytes(salt,(int)sVar4);
    puVar3 = salt;
    if (iVar1 == 0) goto LAB_002d2f21;
  }
  else {
    puVar3 = (uchar *)0x0;
    sVar4 = salt_len;
  }
  iterations_00 = 0x800;
  if (0 < iterations) {
    iterations_00 = iterations;
  }
  iVar1 = CBB_init(&plaintext_cbb,0x80);
  if (((iVar1 == 0) || (iVar1 = EVP_marshal_private_key(&plaintext_cbb,pkey), iVar1 == 0)) ||
     (iVar1 = CBB_finish(&plaintext_cbb,&plaintext,&plaintext_len), iVar1 == 0)) {
    CBB_cleanup(&plaintext_cbb);
  }
  else {
    iVar1 = CBB_add_asn1(local_178,&epki,0x20000010);
    if ((iVar1 != 0) &&
       (iVar1 = pkcs12_pbe_encrypt_init
                          (&epki,&ctx.ctx_,pbe_nid,cipher,iterations_00,local_168,local_160,salt,
                           sVar4), sVar4 = plaintext_len, iVar1 != 0)) {
      uVar2 = EVP_CIPHER_CTX_block_size((EVP_CIPHER_CTX *)&ctx);
      if (plaintext_len <= uVar2 + sVar4) {
        iVar1 = CBB_add_asn1(&epki,&ciphertext,4);
        uVar5 = 0;
        salt = puVar3;
        if ((iVar1 != 0) && (iVar1 = CBB_reserve(&ciphertext,&ptr,uVar2 + sVar4), iVar1 != 0)) {
          iVar1 = EVP_CipherUpdate((EVP_CIPHER_CTX *)&ctx,ptr,&n1,plaintext,(int)plaintext_len);
          if ((iVar1 != 0) &&
             ((iVar1 = EVP_CipherFinal_ex((EVP_CIPHER_CTX *)&ctx,ptr + n1,&n2), iVar1 != 0 &&
              (iVar1 = CBB_did_write(&ciphertext,(long)n2 + (long)n1), iVar1 != 0)))) {
            iVar1 = CBB_flush(local_178);
            uVar5 = (uint)(iVar1 != 0);
          }
        }
        goto LAB_002d2f21;
      }
      ERR_put_error(0x13,0,0x76,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                    ,0x1c1);
    }
  }
  uVar5 = 0;
  salt = puVar3;
LAB_002d2f21:
  OPENSSL_free(plaintext);
  OPENSSL_free(salt);
  EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&ctx);
  return uVar5;
}

Assistant:

int PKCS8_marshal_encrypted_private_key(CBB *out, int pbe_nid,
                                        const EVP_CIPHER *cipher,
                                        const char *pass, size_t pass_len,
                                        const uint8_t *salt, size_t salt_len,
                                        int iterations, const EVP_PKEY *pkey) {
  int ret = 0;
  uint8_t *plaintext = NULL, *salt_buf = NULL;
  size_t plaintext_len = 0;
  bssl::ScopedEVP_CIPHER_CTX ctx;

  {
    // Generate a random salt if necessary.
    if (salt == NULL) {
      if (salt_len == 0) {
        salt_len = PKCS5_SALT_LEN;
      }

      salt_buf = reinterpret_cast<uint8_t *>(OPENSSL_malloc(salt_len));
      if (salt_buf == NULL || !RAND_bytes(salt_buf, salt_len)) {
        goto err;
      }

      salt = salt_buf;
    }

    if (iterations <= 0) {
      iterations = PKCS12_DEFAULT_ITER;
    }

    // Serialize the input key.
    CBB plaintext_cbb;
    if (!CBB_init(&plaintext_cbb, 128) ||
        !EVP_marshal_private_key(&plaintext_cbb, pkey) ||
        !CBB_finish(&plaintext_cbb, &plaintext, &plaintext_len)) {
      CBB_cleanup(&plaintext_cbb);
      goto err;
    }

    CBB epki;
    if (!CBB_add_asn1(out, &epki, CBS_ASN1_SEQUENCE) ||
        !pkcs12_pbe_encrypt_init(&epki, ctx.get(), pbe_nid, cipher,
                                 (uint32_t)iterations, pass, pass_len, salt,
                                 salt_len)) {
      goto err;
    }

    size_t max_out = plaintext_len + EVP_CIPHER_CTX_block_size(ctx.get());
    if (max_out < plaintext_len) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_TOO_LONG);
      goto err;
    }

    CBB ciphertext;
    uint8_t *ptr;
    int n1, n2;
    if (!CBB_add_asn1(&epki, &ciphertext, CBS_ASN1_OCTETSTRING) ||
        !CBB_reserve(&ciphertext, &ptr, max_out) ||
        !EVP_CipherUpdate(ctx.get(), ptr, &n1, plaintext, plaintext_len) ||
        !EVP_CipherFinal_ex(ctx.get(), ptr + n1, &n2) ||
        !CBB_did_write(&ciphertext, n1 + n2) || !CBB_flush(out)) {
      goto err;
    }

    ret = 1;
  }

err:
  OPENSSL_free(plaintext);
  OPENSSL_free(salt_buf);
  return ret;
}